

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::TestCaseFilter::TestCaseFilter(TestCaseFilter *this,string *testSpec,DoWhat matchBehaviour)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  DoWhat DVar5;
  long *plVar6;
  bool bVar7;
  long *local_90;
  ulong local_88;
  long local_80 [2];
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  (this->m_stringToMatch)._M_dataplus._M_p = (pointer)&(this->m_stringToMatch).field_2;
  pcVar1 = (testSpec->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + testSpec->_M_string_length);
  this->m_filterType = matchBehaviour;
  this->m_wildcardPosition = NoWildcard;
  if (matchBehaviour != AutoDetectBehaviour) goto LAB_00132817;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"exclude:","");
  uVar3 = local_68;
  uVar2 = (this->m_stringToMatch)._M_string_length;
  if ((uVar2 < local_68) ||
     (std::__cxx11::string::substr((ulong)&local_50,(ulong)this), local_48 != local_68)) {
    bVar7 = false;
  }
  else if (local_48 == 0) {
    bVar7 = true;
  }
  else {
    iVar4 = bcmp(local_50,local_70,local_48);
    bVar7 = iVar4 == 0;
  }
  if ((uVar3 <= uVar2) && (local_50 != local_40)) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (bVar7) {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
    std::__cxx11::string::operator=((string *)this,(string *)&local_70);
    plVar6 = local_70;
    if (local_70 != local_60) {
LAB_00132807:
      operator_delete(plVar6,local_60[0] + 1);
    }
LAB_0013280f:
    DVar5 = ExcludeTests;
  }
  else {
    local_90 = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"~","");
    uVar3 = local_88;
    uVar2 = (this->m_stringToMatch)._M_string_length;
    if ((uVar2 < local_88) ||
       (std::__cxx11::string::substr((ulong)&local_70,(ulong)this), local_68 != local_88)) {
      bVar7 = false;
    }
    else if (local_68 == 0) {
      bVar7 = true;
    }
    else {
      iVar4 = bcmp(local_70,local_90,local_68);
      bVar7 = iVar4 == 0;
    }
    if ((uVar3 <= uVar2) && (local_70 != local_60)) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    DVar5 = IncludeTests;
    if (bVar7) {
      std::__cxx11::string::substr((ulong)&local_90,(ulong)this);
      std::__cxx11::string::operator=((string *)this,(string *)&local_90);
      local_60[0] = local_80[0];
      plVar6 = local_90;
      if (local_90 != local_80) goto LAB_00132807;
      goto LAB_0013280f;
    }
  }
  this->m_filterType = DVar5;
LAB_00132817:
  if (*(this->m_stringToMatch)._M_dataplus._M_p == '*') {
    std::__cxx11::string::substr((ulong)&local_90,(ulong)this);
    std::__cxx11::string::operator=((string *)this,(string *)&local_90);
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    *(undefined1 *)&this->m_wildcardPosition = (char)this->m_wildcardPosition | WildcardAtStart;
  }
  if ((this->m_stringToMatch)._M_dataplus._M_p[(this->m_stringToMatch)._M_string_length - 1] == '*')
  {
    std::__cxx11::string::substr((ulong)&local_90,(ulong)this);
    std::__cxx11::string::operator=((string *)this,(string *)&local_90);
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    *(undefined1 *)&this->m_wildcardPosition = (char)this->m_wildcardPosition | WildcardAtEnd;
  }
  return;
}

Assistant:

TestCaseFilter( const std::string& testSpec, IfFilterMatches::DoWhat matchBehaviour = IfFilterMatches::AutoDetectBehaviour )
        :   m_stringToMatch( testSpec ),
            m_filterType( matchBehaviour ),
            m_wildcardPosition( NoWildcard )
        {
            if( m_filterType == IfFilterMatches::AutoDetectBehaviour ) {
                if( startsWith( m_stringToMatch, "exclude:" ) ) {
                    m_stringToMatch = m_stringToMatch.substr( 8 );
                    m_filterType = IfFilterMatches::ExcludeTests;
                }
                else if( startsWith( m_stringToMatch, "~" ) ) {
                    m_stringToMatch = m_stringToMatch.substr( 1 );
                    m_filterType = IfFilterMatches::ExcludeTests;
                }
                else {
                    m_filterType = IfFilterMatches::IncludeTests;
                }
            }

            if( m_stringToMatch[0] == '*' ) {
                m_stringToMatch = m_stringToMatch.substr( 1 );
                m_wildcardPosition = (WildcardPosition)( m_wildcardPosition | WildcardAtStart );
            }
            if( m_stringToMatch[m_stringToMatch.size()-1] == '*' ) {
                m_stringToMatch = m_stringToMatch.substr( 0, m_stringToMatch.size()-1 );
                m_wildcardPosition = (WildcardPosition)( m_wildcardPosition | WildcardAtEnd );
            }
        }